

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O0

int create_security_message_annotations
              (IOTHUB_MESSAGE_HANDLE messageHandle,AMQP_VALUE *message_annotations_map)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  AMQP_VALUE pAVar4;
  LOGGER_LOG p_Var5;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  _Bool annotation_created;
  int result;
  AMQP_VALUE *message_annotations_map_local;
  IOTHUB_MESSAGE_HANDLE messageHandle_local;
  
  l._4_4_ = 0;
  bVar1 = false;
  _Var2 = IoTHubMessage_IsSecurityMessage(messageHandle);
  if (_Var2) {
    if (*message_annotations_map == (AMQP_VALUE)0x0) {
      pAVar4 = amqpvalue_create_map();
      *message_annotations_map = pAVar4;
      if (pAVar4 == (AMQP_VALUE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"create_security_message_annotations",0x21b,1,
                    "Failed amqpvalue_create_map for annotations");
        }
        l._4_4_ = 0x21c;
      }
      else {
        bVar1 = true;
      }
    }
    if ((l._4_4_ == 0) &&
       (iVar3 = add_map_item(*message_annotations_map,"iothub-interface-id",
                             "urn:azureiot:Security:SecurityAgent:1"), iVar3 != 0)) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"create_security_message_annotations",0x228,1,
                  "Failed adding Security interface id");
      }
      l._4_4_ = 0x229;
      if (bVar1) {
        amqpvalue_destroy(*message_annotations_map);
        *message_annotations_map = (AMQP_VALUE)0x0;
      }
    }
  }
  return l._4_4_;
}

Assistant:

static int create_security_message_annotations(IOTHUB_MESSAGE_HANDLE messageHandle, AMQP_VALUE* message_annotations_map)
{
    int result = RESULT_OK;
    bool annotation_created = false;
    if (IoTHubMessage_IsSecurityMessage(messageHandle))
    {
        if (*message_annotations_map == NULL)
        {
            if ((*message_annotations_map = amqpvalue_create_map()) == NULL)
            {
                LogError("Failed amqpvalue_create_map for annotations");
                result = MU_FAILURE;
            }
            else
            {
                annotation_created = true;
            }
        }

        if (result == RESULT_OK)
        {
            if (add_map_item(*message_annotations_map, SECURITY_INTERFACE_ID, SECURITY_INTERFACE_ID_VALUE) != RESULT_OK)
            {
                LogError("Failed adding Security interface id");
                result = MU_FAILURE;
                if (annotation_created)
                {
                    amqpvalue_destroy(*message_annotations_map);
                    *message_annotations_map = NULL;
                }
            }
        }
    }
    return result;
}